

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void __thiscall mat_lib::matrix<double>::matrix(matrix<double> *this,list *mat)

{
  undefined1 auVar1 [16];
  ssize_t sVar2;
  logic_error *plVar3;
  ulong uVar4;
  element_t *peVar5;
  size_t sVar6;
  size_t sVar7;
  result_type rVar8;
  proxy<boost::python::api::item_policies> local_b8;
  proxy<boost::python::api::item_policies> local_a8;
  object local_98;
  extract<double> local_90;
  int local_6c;
  undefined1 local_68 [4];
  int j;
  object local_58;
  int local_50;
  undefined4 local_4c;
  int i;
  object local_38;
  int local_30;
  int len_col;
  int local_1c;
  list *plStack_18;
  int len_row;
  list *mat_local;
  matrix<double> *this_local;
  
  plStack_18 = mat;
  mat_local = (list *)this;
  base_matrix<double>::base_matrix(&this->super_base_matrix<double>);
  sVar2 = boost::python::len((object *)mat);
  local_1c = (int)sVar2;
  if (local_1c == 0) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar3,"can\'t create empty arrays");
    __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_4c = 0;
  boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
            ((object_operators<boost::python::api::object> *)&i,(int *)mat);
  boost::python::api::proxy::operator_cast_to_object((proxy *)&local_38);
  sVar2 = boost::python::len(&local_38);
  boost::python::api::object::~object(&local_38);
  boost::python::api::proxy<boost::python::api::item_policies>::~proxy
            ((proxy<boost::python::api::item_policies> *)&i);
  this->rows__ = (long)local_1c;
  this->columns__ = (long)(int)sVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->rows__ * this->columns__;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_30 = (int)sVar2;
  peVar5 = (element_t *)operator_new__(uVar4);
  this->elements__ = peVar5;
  local_50 = 0;
  while( true ) {
    if (local_1c <= local_50) {
      return;
    }
    sVar7 = this->columns__;
    boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
              ((object_operators<boost::python::api::object> *)local_68,(int *)mat);
    boost::python::api::proxy::operator_cast_to_object((proxy *)&local_58);
    sVar6 = boost::python::len(&local_58);
    boost::python::api::object::~object(&local_58);
    boost::python::api::proxy<boost::python::api::item_policies>::~proxy
              ((proxy<boost::python::api::item_policies> *)local_68);
    if (sVar7 != sVar6) break;
    for (local_6c = 0; local_6c < local_30; local_6c = local_6c + 1) {
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)&local_b8,(int *)mat);
      boost::python::api::
      object_operators<boost::python::api::proxy<boost::python::api::item_policies>_>::
      operator[]<int>((object_operators<boost::python::api::proxy<boost::python::api::item_policies>_>
                       *)&local_a8,(int *)&local_b8);
      boost::python::api::proxy::operator_cast_to_object((proxy *)&local_98);
      boost::python::extract<double>::extract(&local_90,&local_98);
      rVar8 = boost::python::extract::operator_cast_to_double((extract *)&local_90);
      peVar5 = this->elements__;
      sVar7 = offset__(this,(long)local_50,local_6c);
      peVar5[sVar7] = rVar8;
      boost::python::extract<double>::~extract(&local_90);
      boost::python::api::object::~object(&local_98);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy(&local_a8);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy(&local_b8);
    }
    local_50 = local_50 + 1;
  }
  plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar3,"the array must have the same number of columns");
  __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

matrix(boost::python::list mat){
          int len_row = boost::python::len(mat);
          if (len_row == 0)
              throw logic_error("can't create empty arrays");
          int len_col = boost::python::len(mat[0]);

          rows__ = len_row;
          columns__ = len_col;
          elements__ = new element_t[rows__ * columns__];

          for (int i = 0; i < len_row; i++) {

              if (columns__ != boost::python::len(mat[i]))
                  throw logic_error("the array must have the same number of columns");

              for (int j = 0; j < len_col; j++) {
                  elements__[offset__(i,j)] = boost::python::extract<element_t>(mat[i][j]);
              }
          }

      }